

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *psVar4;
  Parse *pPVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  u8 uVar10;
  int iVar11;
  uint uVar12;
  u16 uVar13;
  uint uVar14;
  ulong uVar15;
  
  if (z == (char *)0x0) {
    if ((pMem->flags & 0x2400) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    return 0;
  }
  psVar4 = pMem->db;
  if (psVar4 == (sqlite3 *)0x0) {
    iVar11 = 1000000000;
  }
  else {
    iVar11 = psVar4->aLimit[0];
  }
  uVar14 = 2;
  if (enc == '\0') {
    uVar14 = 0x10;
  }
  if (n < 0) {
    if (enc == '\x01') {
      sVar8 = strlen(z);
      uVar15 = (ulong)((uint)sVar8 & 0x7fffffff);
    }
    else {
      uVar15 = 0;
      if (-1 < iVar11) {
        do {
          if (z[uVar15 + 1] == '\0' && z[uVar15] == '\0') break;
          uVar15 = uVar15 + 2;
        } while ((int)uVar15 <= iVar11);
      }
    }
    n = (int)uVar15;
    uVar14 = uVar14 | 0x200;
  }
  uVar13 = (u16)uVar14;
  if (xDel != (_func_void_void_ptr *)0xffffffffffffffff) {
    if (((pMem->flags & 0x2400) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = z;
      psVar4 = pMem->db;
      if (((psVar4 == (sqlite3 *)0x0) || (z < (psVar4->lookaside).pStart)) ||
         ((psVar4->lookaside).pEnd <= z)) {
        uVar14 = (*sqlite3Config.m.xSize)(z);
      }
      else {
        uVar14 = (uint)(psVar4->lookaside).sz;
      }
      pMem->szMalloc = uVar14;
    }
    else {
      pMem->xDel = xDel;
      uVar13 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar13 + 0x400;
    }
    goto LAB_0012e0b2;
  }
  iVar7 = 0;
  if (uVar14 >> 9 != 0) {
    iVar7 = (enc != '\x01') + 1;
  }
  if (iVar11 < n) {
    iVar7 = 0x12;
    if ((psVar4 != (sqlite3 *)0x0) && (pPVar5 = psVar4->pParse, pPVar5 != (Parse *)0x0)) {
      pPVar5->rc = 0x12;
      pPVar5->nErr = pPVar5->nErr + 1;
    }
    bVar6 = false;
  }
  else {
    uVar12 = iVar7 + n;
    uVar14 = 0x20;
    if (0x20 < uVar12) {
      uVar14 = uVar12;
    }
    if (pMem->szMalloc < (int)uVar14) {
      bVar6 = false;
      iVar7 = sqlite3VdbeMemGrow(pMem,uVar14,0);
      if (iVar7 != 0) {
        iVar7 = 7;
        goto LAB_0012e0a9;
      }
    }
    else {
      pMem->z = pMem->zMalloc;
      pMem->flags = pMem->flags & 0xd;
    }
    pvVar9 = memcpy(pMem->z,z,(ulong)uVar12);
    iVar7 = (int)pvVar9;
    bVar6 = true;
  }
LAB_0012e0a9:
  if (!bVar6) {
    return iVar7;
  }
LAB_0012e0b2:
  pMem->n = n;
  pMem->flags = uVar13;
  uVar10 = '\x01';
  if (1 < enc) {
    uVar10 = enc;
  }
  pMem->enc = uVar10;
  if (1 < enc) {
    if (n < 2) {
      uVar10 = '\0';
    }
    else {
      cVar2 = *pMem->z;
      cVar3 = pMem->z[1];
      uVar10 = '\x02';
      if (cVar3 != -2 || cVar2 != -1) {
        uVar10 = (cVar3 == -1 && cVar2 == -2) * '\x03';
      }
    }
    if (uVar10 != '\0') {
      iVar7 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar7 != 0) {
        return 7;
      }
      sVar8 = (long)pMem->n - 2;
      pMem->n = (int)sVar8;
      memmove(pMem->z,pMem->z + 2,sVar8);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar10;
    }
  }
  iVar7 = 0x12;
  if (n <= iVar11) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = 0x7fffffff & (int)strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    u32 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}